

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O1

void __thiscall
xLearn::FMScore::calc_grad_ftrl(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  real_t *prVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  Model *pMVar11;
  pointer pNVar12;
  ulong uVar13;
  int iVar14;
  ulong __n;
  real_t *prVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar19;
  undefined1 auVar23 [16];
  float fVar20;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  real_t rVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM6 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_101;
  real_t local_100;
  int local_fc;
  undefined1 local_f8 [16];
  Model *local_e8;
  real_t *local_e0;
  SparseRow *local_d8;
  pointer local_d0;
  undefined1 local_c8 [16];
  pointer local_b0;
  real_t *local_a8;
  real_t *local_a0;
  real_t *local_98;
  value_type_conflict1 local_8c;
  real_t local_88;
  real_t rStack_84;
  real_t rStack_80;
  real_t rStack_7c;
  real_t local_78;
  real_t rStack_74;
  real_t rStack_70;
  real_t rStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  auVar31._4_60_ = in_register_00001244;
  auVar31._0_4_ = norm;
  local_100 = norm;
  if (norm < 0.0) {
    fVar19 = sqrtf(norm);
  }
  else {
    auVar22 = vsqrtss_avx(auVar31._0_16_,auVar31._0_16_);
    fVar19 = auVar22._0_4_;
  }
  auVar22 = in_ZMM6._0_16_;
  uVar5 = model->num_feat_;
  pNVar12 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_e8 = model;
  local_d8 = row;
  if (pNVar12 !=
      (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    prVar15 = model->param_w_;
    do {
      uVar6 = pNVar12->feat_id;
      if (uVar6 < uVar5) {
        uVar9 = uVar6 * 3;
        uVar4 = uVar6 * 3 + 1;
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar12->feat_val * fVar19)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416((uint)prVar15[uVar9]));
        fVar20 = prVar15[uVar4];
        auVar22 = vfmadd213ss_fma(auVar24,auVar24,ZEXT416((uint)fVar20));
        fVar17 = auVar22._0_4_;
        prVar15[uVar4] = fVar17;
        if (fVar17 < 0.0) {
          local_f8._0_4_ = fVar20;
          fVar17 = sqrtf(fVar17);
          fVar20 = (float)local_f8._0_4_;
        }
        else {
          auVar22 = vsqrtss_avx(auVar22,auVar22);
          fVar17 = auVar22._0_4_;
        }
        if (fVar20 < 0.0) {
          local_f8._0_4_ = fVar17;
          fVar20 = sqrtf(fVar20);
          fVar17 = (float)local_f8._0_4_;
        }
        else {
          auVar22 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
          fVar20 = auVar22._0_4_;
        }
        uVar6 = uVar6 * 3 + 2;
        auVar22._0_4_ = (fVar17 - fVar20) / (this->super_Score).alpha_;
        auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar22 = vfnmadd231ss_fma(ZEXT416(auVar24._0_4_),auVar22,ZEXT416((uint)prVar15[uVar9]));
        fVar17 = auVar22._0_4_ + prVar15[uVar6];
        prVar15[uVar6] = fVar17;
        auVar24 = ZEXT816(0);
        uVar7 = vcmpss_avx512f(auVar24,ZEXT416((uint)fVar17),1);
        bVar8 = (bool)((byte)uVar7 & 1);
        fVar21 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
        fVar20 = (this->super_Score).lambda_1_;
        if (fVar20 < fVar17 * fVar21) {
          rVar27 = (this->super_Score).beta_;
          fVar18 = prVar15[uVar4];
          if (fVar18 < 0.0) {
            local_f8._0_4_ = fVar20;
            local_c8 = ZEXT416((uint)fVar21);
            local_e0 = (real_t *)CONCAT44(local_e0._4_4_,rVar27);
            fVar18 = sqrtf(fVar18);
            rVar27 = local_e0._0_4_;
            auVar22 = local_c8;
            fVar20 = (float)local_f8._0_4_;
          }
          else {
            auVar22 = vsqrtss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
            fVar18 = auVar22._0_4_;
            auVar22 = ZEXT416((uint)fVar21);
          }
          auVar22 = vfmsub213ss_fma(ZEXT416((uint)fVar20),auVar22,ZEXT416((uint)fVar17));
          auVar24._0_4_ =
               auVar22._0_4_ /
               ((rVar27 + fVar18) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar24._4_12_ = auVar22._4_12_;
        }
        prVar15[uVar9] = auVar24._0_4_;
        row = local_d8;
      }
      auVar22 = in_ZMM6._0_16_;
      pNVar12 = pNVar12 + 1;
    } while (pNVar12 !=
             (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pMVar11 = local_e8;
  prVar15 = local_e8->param_b_;
  fVar19 = prVar15[1];
  auVar24 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar19));
  fVar20 = auVar24._0_4_;
  prVar15[1] = fVar20;
  if (fVar20 < 0.0) {
    fVar20 = sqrtf(fVar20);
  }
  else {
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar20 = auVar24._0_4_;
  }
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    auVar24 = vsqrtss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
    fVar19 = auVar24._0_4_;
  }
  auVar23._0_4_ = (fVar20 - fVar19) / (this->super_Score).alpha_;
  auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar24 = vfnmadd132ss_fma(auVar23,ZEXT416((uint)pg),ZEXT416((uint)*prVar15));
  fVar20 = auVar24._0_4_ + prVar15[2];
  prVar15[2] = fVar20;
  auVar28._0_12_ = ZEXT812(0);
  auVar28._12_4_ = 0;
  uVar7 = vcmpss_avx512f(auVar28,ZEXT416((uint)fVar20),1);
  bVar8 = (bool)((byte)uVar7 & 1);
  fVar17 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
  fVar19 = (this->super_Score).lambda_1_;
  if (fVar19 < fVar20 * fVar17) {
    auVar24 = vfmsub213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar17),ZEXT416((uint)fVar20));
    fVar19 = (this->super_Score).beta_;
    fVar20 = prVar15[1];
    if (fVar20 < 0.0) {
      fVar20 = sqrtf(fVar20);
      auVar24 = ZEXT416(auVar24._0_4_);
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
      fVar20 = auVar23._0_4_;
    }
    auVar28._0_4_ =
         auVar24._0_4_ /
         ((fVar19 + fVar20) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
    auVar28._4_12_ = auVar24._4_12_;
  }
  *prVar15 = auVar28._0_4_;
  auVar24 = vcvtusi2ss_avx512f(auVar22,pMVar11->num_K_);
  auVar24 = ZEXT416((uint)(auVar24._0_4_ * 0.25));
  auVar24 = vroundss_avx(auVar24,auVar24,10);
  iVar14 = vcvttss2usi_avx512f(auVar24);
  __n = (ulong)(uint)(iVar14 * 4);
  auVar24 = vcvtusi2ss_avx512f(auVar22,iVar14 * 4);
  auVar22 = vcvtusi2ss_avx512f(auVar22,pMVar11->aux_size_);
  local_fc = vcvttss2usi_avx512f(ZEXT416((uint)(auVar22._0_4_ * auVar24._0_4_)));
  local_78 = (this->super_Score).alpha_;
  local_88 = (this->super_Score).lambda_2_;
  local_8c = 0.0;
  rStack_84 = local_88;
  rStack_80 = local_88;
  rStack_7c = local_88;
  rStack_74 = local_78;
  rStack_70 = local_78;
  rStack_6c = local_78;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,__n,&local_8c,&local_101);
  pNVar12 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pNVar12 !=
      (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      uVar6 = pNVar12->feat_id;
      if ((uVar6 < uVar5) && (__n != 0)) {
        prVar15 = pMVar11->param_v_;
        fVar19 = local_100 * pNVar12->feat_val;
        uVar13 = 0;
        do {
          pfVar1 = prVar15 + uVar6 * local_fc + uVar13;
          pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13;
          auVar29._0_4_ = fVar19 * *pfVar1 + *pfVar2;
          auVar29._4_4_ = fVar19 * pfVar1[1] + pfVar2[1];
          auVar29._8_4_ = fVar19 * pfVar1[2] + pfVar2[2];
          auVar29._12_4_ = fVar19 * pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])
           (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + uVar13) = auVar29;
          uVar13 = uVar13 + 4;
        } while (uVar13 < __n);
      }
      pNVar12 = pNVar12 + 1;
    } while (pNVar12 !=
             (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_b0 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  pNVar12 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pNVar12 !=
      (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_d0 = pNVar12;
      if ((pNVar12->feat_id < uVar5) && (__n != 0)) {
        prVar15 = local_e8->param_v_ + pNVar12->feat_id * local_fc;
        local_58 = local_100 * pNVar12->feat_val;
        local_68 = local_58 * pg;
        local_a0 = prVar15 + __n;
        local_a8 = prVar15 + (uint)(iVar14 << 3);
        uVar13 = 0;
        local_98 = prVar15;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        fStack_54 = local_58;
        fStack_50 = local_58;
        fStack_4c = local_58;
        do {
          pfVar1 = local_98 + uVar13;
          fVar19 = *pfVar1;
          fVar20 = pfVar1[1];
          fVar17 = pfVar1[2];
          fVar21 = pfVar1[3];
          auVar22 = *(undefined1 (*) [16])(local_a0 + uVar13);
          auVar33._0_4_ = fVar19 * local_58;
          auVar33._4_4_ = fVar20 * fStack_54;
          auVar33._8_4_ = fVar17 * fStack_50;
          auVar33._12_4_ = fVar21 * fStack_4c;
          auVar24 = vsubps_avx(*(undefined1 (*) [16])(local_b0 + uVar13),auVar33);
          auVar25._0_4_ = fVar19 * local_88 + auVar24._0_4_ * local_68;
          auVar25._4_4_ = fVar20 * rStack_84 + auVar24._4_4_ * fStack_64;
          auVar25._8_4_ = fVar17 * rStack_80 + auVar24._8_4_ * fStack_60;
          auVar25._12_4_ = fVar21 * rStack_7c + auVar24._12_4_ * fStack_5c;
          auVar32._0_4_ = auVar22._0_4_ + auVar25._0_4_ * auVar25._0_4_;
          auVar32._4_4_ = auVar22._4_4_ + auVar25._4_4_ * auVar25._4_4_;
          auVar32._8_4_ = auVar22._8_4_ + auVar25._8_4_ * auVar25._8_4_;
          auVar32._12_4_ = auVar22._12_4_ + auVar25._12_4_ * auVar25._12_4_;
          auVar24 = vsqrtps_avx(auVar32);
          auVar22 = vsqrtps_avx(auVar22);
          auVar22 = vsubps_avx(auVar24,auVar22);
          auVar10._4_4_ = rStack_74;
          auVar10._0_4_ = local_78;
          auVar10._8_4_ = rStack_70;
          auVar10._12_4_ = rStack_6c;
          auVar22 = vdivps_avx(auVar22,auVar10);
          auVar30._0_4_ = fVar19 * auVar22._0_4_;
          auVar30._4_4_ = fVar20 * auVar22._4_4_;
          auVar30._8_4_ = fVar17 * auVar22._8_4_;
          auVar30._12_4_ = fVar21 * auVar22._12_4_;
          auVar22 = vsubps_avx(auVar25,auVar30);
          pfVar1 = local_a8 + uVar13;
          fVar19 = pfVar1[1];
          fVar20 = pfVar1[2];
          fVar17 = pfVar1[3];
          prVar3 = local_a8 + uVar13;
          *prVar3 = auVar22._0_4_ + *pfVar1;
          prVar3[1] = auVar22._4_4_ + fVar19;
          prVar3[2] = auVar22._8_4_ + fVar20;
          prVar3[3] = auVar22._12_4_ + fVar17;
          *(undefined1 (*) [16])(local_a0 + uVar13) = auVar32;
          lVar16 = 4;
          local_e0 = prVar15;
          do {
            fVar19 = prVar15[(uint)(iVar14 << 3)];
            auVar26 = ZEXT816(0) << 0x40;
            uVar7 = vcmpss_avx512f(auVar26,ZEXT416((uint)fVar19),1);
            bVar8 = (bool)((byte)uVar7 & 1);
            fVar17 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
            fVar20 = (this->super_Score).lambda_1_;
            if (fVar20 < fVar19 * fVar17) {
              fVar18 = (this->super_Score).beta_;
              fVar21 = prVar15[__n];
              if (fVar21 < 0.0) {
                local_f8 = ZEXT416((uint)fVar17);
                local_c8._0_4_ = fVar18;
                fVar21 = sqrtf(fVar21);
                fVar18 = (float)local_c8._0_4_;
                auVar22 = local_f8;
              }
              else {
                auVar22 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
                fVar21 = auVar22._0_4_;
                auVar22 = ZEXT416((uint)fVar17);
              }
              auVar22 = vfmsub213ss_fma(ZEXT416((uint)fVar20),auVar22,ZEXT416((uint)fVar19));
              auVar26._0_4_ =
                   auVar22._0_4_ /
                   ((fVar18 + fVar21) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
              auVar26._4_12_ = auVar22._4_12_;
            }
            *prVar15 = auVar26._0_4_;
            prVar15 = prVar15 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
          uVar13 = uVar13 + 4;
          prVar15 = local_e0 + 4;
        } while (uVar13 < __n);
      }
      pNVar12 = local_d0 + 1;
    } while (pNVar12 !=
             (local_d8->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FMScore::calc_grad_ftrl(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }  
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
 for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w_base = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      real_t* w = w_base + d;
      real_t* wg = w_base + aligned_k + d;
      real_t* z = w_base + aligned_k*2 + d;
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w);
      __m128 XMMwg = _mm_load_ps(wg);
      __m128 XMMz = _mm_load_ps(z);
      __m128 XMMg = _mm_add_ps(
                    _mm_mul_ps(XMML2, XMMw),
                    _mm_mul_ps(XMMpgv,
                    _mm_sub_ps(XMMs,
                      _mm_mul_ps(XMMw, XMMv))));
      __m128 XMMsigma = _mm_div_ps(
                        _mm_sub_ps(
                        _mm_sqrt_ps(
                        _mm_add_ps(XMMwg,
                        _mm_mul_ps(XMMg, XMMg))),
                        _mm_sqrt_ps(XMMwg)), XMMalpha);
      XMMz = _mm_add_ps(XMMz,
             _mm_sub_ps(XMMg,
             _mm_mul_ps(XMMsigma, XMMw)));
      _mm_store_ps(z, XMMz);
      XMMwg = _mm_add_ps(XMMwg,
              _mm_mul_ps(XMMg, XMMg));
      _mm_store_ps(wg, XMMwg);
      // Update w. SSE mat not faster.
      for (size_t i = 0; i < kAlign; ++i) {
        real_t z_value = *(z+i);
        int sign = z_value > 0 ? 1:-1;
        if (sign * z_value <= lambda_1_) {
          *(w+i) = 0;
        } else {
          *(w+i) = (sign*lambda_1_-z_value) / 
              ((beta_ + sqrt(*(wg+i))) / alpha_ + lambda_2_);
        }
      }
    }
  }
}